

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::DynamicTypeHandler::VerifyIsExtensible
          (DynamicTypeHandler *this,ScriptContext *scriptContext,bool alwaysThrow)

{
  byte bVar1;
  bool bVar2;
  ThreadContext *this_00;
  bool alwaysThrow_local;
  ScriptContext *scriptContext_local;
  DynamicTypeHandler *this_local;
  
  bVar1 = GetFlags(this);
  if ((bVar1 & 1) == 0) {
    if ((alwaysThrow) && (scriptContext != (ScriptContext *)0x0)) {
      this_00 = ScriptContext::GetThreadContext(scriptContext);
      bVar2 = ThreadContext::RecordImplicitException(this_00);
      if (bVar2) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec4a,(PCWSTR)0x0);
      }
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicTypeHandler::VerifyIsExtensible(ScriptContext* scriptContext, bool alwaysThrow)
    {
        if (!(this->GetFlags() & IsExtensibleFlag))
        {
            if (alwaysThrow)
            {
                if (scriptContext && scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NonExtensibleObject);
                }
            }
            return false;
        }

        return true;
    }